

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key.cpp
# Opt level: O1

bool __thiscall CKey::VerifyPubKey(CKey *this,CPubKey *pubkey)

{
  bool bVar1;
  long in_FS_OFFSET;
  Span<unsigned_char> output;
  Span<unsigned_char> bytes;
  uint256 hash;
  string str;
  uchar rnd [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> vchSig;
  uint256 local_d8;
  long *local_b0;
  size_t local_a8;
  long local_a0 [2];
  uchar local_90 [8];
  undefined1 local_88 [16];
  pointer local_78;
  uint32_t auStack_70 [2];
  uchar local_68 [72];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->fCompressed == ((pubkey->vch[0] & 0xfe) == 2)) {
    local_b0 = local_a0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0,"Bitcoin key verification\n","");
    bytes.m_size = 8;
    bytes.m_data = local_90;
    GetRandBytes(bytes);
    local_d8.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    local_d8.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    local_d8.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    local_d8.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    local_d8.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    local_d8.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    local_d8.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    local_d8.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    local_d8.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
    local_d8.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
    local_d8.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
    local_d8.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
    local_d8.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
    local_d8.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
    local_d8.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
    local_d8.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
    local_d8.super_base_blob<256U>.m_data._M_elems[0] = '\0';
    local_d8.super_base_blob<256U>.m_data._M_elems[1] = '\0';
    local_d8.super_base_blob<256U>.m_data._M_elems[2] = '\0';
    local_d8.super_base_blob<256U>.m_data._M_elems[3] = '\0';
    local_d8.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    local_d8.super_base_blob<256U>.m_data._M_elems[5] = '\0';
    local_d8.super_base_blob<256U>.m_data._M_elems[6] = '\0';
    local_d8.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    local_d8.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    local_d8.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    local_d8.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    local_d8.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    local_d8.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    local_d8.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    local_d8.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    local_d8.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    local_68[0x30] = '\0';
    local_68[0x31] = '\0';
    local_68[0x32] = '\0';
    local_68[0x33] = '\0';
    local_68[0x34] = '\0';
    local_68[0x35] = '\0';
    local_68[0x36] = '\0';
    local_68[0x37] = '\0';
    local_68[0x38] = '\0';
    local_68[0x39] = '\0';
    local_68[0x3a] = '\0';
    local_68[0x3b] = '\0';
    local_68[0x3c] = '\0';
    local_68[0x3d] = '\0';
    local_68[0x3e] = '\0';
    local_68[0x3f] = '\0';
    local_68[0x20] = '\0';
    local_68[0x21] = '\0';
    local_68[0x22] = '\0';
    local_68[0x23] = '\0';
    local_68[0x24] = '\0';
    local_68[0x25] = '\0';
    local_68[0x26] = '\0';
    local_68[0x27] = '\0';
    local_68[0x28] = '\0';
    local_68[0x29] = '\0';
    local_68[0x2a] = '\0';
    local_68[0x2b] = '\0';
    local_68[0x2c] = '\0';
    local_68[0x2d] = '\0';
    local_68[0x2e] = '\0';
    local_68[0x2f] = '\0';
    local_68[0x10] = '\0';
    local_68[0x11] = '\0';
    local_68[0x12] = '\0';
    local_68[0x13] = '\0';
    local_68[0x14] = '\0';
    local_68[0x15] = '\0';
    local_68[0x16] = '\0';
    local_68[0x17] = '\0';
    local_68[0x18] = '\0';
    local_68[0x19] = '\0';
    local_68[0x1a] = '\0';
    local_68[0x1b] = '\0';
    local_68[0x1c] = '\0';
    local_68[0x1d] = '\0';
    local_68[0x1e] = '\0';
    local_68[0x1f] = '\0';
    local_68[0] = '\0';
    local_68[1] = '\0';
    local_68[2] = '\0';
    local_68[3] = '\0';
    local_68[4] = '\0';
    local_68[5] = '\0';
    local_68[6] = '\0';
    local_68[7] = '\0';
    local_68[8] = '\0';
    local_68[9] = '\0';
    local_68[10] = '\0';
    local_68[0xb] = '\0';
    local_68[0xc] = '\0';
    local_68[0xd] = '\0';
    local_68[0xe] = '\0';
    local_68[0xf] = '\0';
    local_78 = (pointer)0x0;
    auStack_70[0] = 0;
    auStack_70[1] = 0;
    local_88._0_8_ = (pointer)0x0;
    local_88._8_8_ = (pointer)0x0;
    local_68[0x40] = '\0';
    local_68[0x41] = '\0';
    local_68[0x42] = '\0';
    local_68[0x43] = '\0';
    local_68[0x44] = '\0';
    local_68[0x45] = '\0';
    local_68[0x46] = '\0';
    local_68[0x47] = '\0';
    CSHA256::CSHA256((CSHA256 *)local_88);
    CSHA256::Write((CSHA256 *)local_88,(uchar *)local_b0,local_a8);
    CSHA256::Write((CSHA256 *)local_88,local_90,8);
    output.m_size = 0x20;
    output.m_data = (uchar *)&local_d8;
    CHash256::Finalize((CHash256 *)local_88,output);
    local_88._0_8_ = (pointer)0x0;
    local_88._8_8_ = (pointer)0x0;
    local_78 = (pointer)0x0;
    Sign(this,&local_d8,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_88,true,0);
    bVar1 = CPubKey::Verify(pubkey,&local_d8,
                            (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_88);
    if ((pointer)local_88._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_88._0_8_,(long)local_78 - local_88._0_8_);
    }
    if (local_b0 != local_a0) {
      operator_delete(local_b0,local_a0[0] + 1);
    }
  }
  else {
    bVar1 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool CKey::VerifyPubKey(const CPubKey& pubkey) const {
    if (pubkey.IsCompressed() != fCompressed) {
        return false;
    }
    unsigned char rnd[8];
    std::string str = "Bitcoin key verification\n";
    GetRandBytes(rnd);
    uint256 hash{Hash(str, rnd)};
    std::vector<unsigned char> vchSig;
    Sign(hash, vchSig);
    return pubkey.Verify(hash, vchSig);
}